

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDFDocumentHandler.cpp
# Opt level: O1

EStatusCode __thiscall
PDFDocumentHandler::MergePDFPageToFormXObject
          (PDFDocumentHandler *this,PDFFormXObject *inTargetFormXObject,
          unsigned_long inSourcePageIndex)

{
  EStatusCode EVar1;
  unsigned_long uVar2;
  Trace *pTVar3;
  
  uVar2 = PDFParser::GetPagesCount(this->mParser);
  if (inSourcePageIndex < uVar2) {
    EVar1 = MergePDFPageForXObject(this,inTargetFormXObject,inSourcePageIndex);
    if (EVar1 == eSuccess) {
      EVar1 = eSuccess;
    }
    else {
      pTVar3 = Trace::DefaultTrace();
      Trace::TraceToLog(pTVar3,
                        "PDFDocumentHandler::MergePDFPageToFormXObject, failed to merge page %ld",
                        inSourcePageIndex);
    }
  }
  else {
    pTVar3 = Trace::DefaultTrace();
    uVar2 = PDFParser::GetPagesCount(this->mParser);
    Trace::TraceToLog(pTVar3,
                      "PDFDocumentHandler::MergePDFPageToFormXObject, request object index %ld is larger than maximum page for input document = %ld"
                      ,inSourcePageIndex,uVar2 - 1);
    EVar1 = eFailure;
  }
  return EVar1;
}

Assistant:

EStatusCode PDFDocumentHandler::MergePDFPageToFormXObject(PDFFormXObject* inTargetFormXObject,
                                                          unsigned long inSourcePageIndex)
{
	EStatusCode result;
    
	if(inSourcePageIndex < mParser->GetPagesCount())
	{
		result = MergePDFPageForXObject(inTargetFormXObject,inSourcePageIndex);
		if(result != eSuccess)
			TRACE_LOG1("PDFDocumentHandler::MergePDFPageToFormXObject, failed to merge page %ld",inSourcePageIndex);
	}
	else
	{
		TRACE_LOG2(
                   "PDFDocumentHandler::MergePDFPageToFormXObject, request object index %ld is larger than maximum page for input document = %ld", 
                   inSourcePageIndex,
                   mParser->GetPagesCount()-1);
		result = eFailure;
	}
	return result;
    
}